

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O3

void __thiscall
crnlib::dxt_hc::create_alpha_selector_codebook_task(dxt_hc *this,uint64 data,void *pData_ptr)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  ushort uVar4;
  uint uVar5;
  alpha_cluster *paVar6;
  color_quad_u8 (*pacVar7) [16];
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  int *piVar20;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  uint p_2;
  uint uVar24;
  uint uVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  uint s;
  ulong uVar29;
  long lVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  uint E6 [8] [64];
  int local_a38 [128];
  int local_838 [64];
  int aiStack_738 [64];
  int aiStack_638 [64];
  int aiStack_538 [64];
  int aiStack_438 [64];
  int aiStack_338 [64];
  int aiStack_238 [64];
  int aiStack_138 [66];
  
  uVar27 = CONCAT44(0,this->m_pTask_pool->m_num_threads + 1);
  uVar21 = (ulong)(this->m_num_blocks >> (this->m_has_subblocks & 0x1fU));
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar27;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar21 * data;
  uVar27 = ((data + 1) * uVar21) / uVar27;
  if (SUB164(auVar10 / auVar9,0) < (uint)uVar27) {
    uVar21 = SUB168(auVar10 / auVar9,0) & 0xffffffff;
    uVar18 = this->m_num_alpha_blocks;
    do {
      if (uVar18 - 1 < 0xfffffffe) {
        uVar11 = (int)uVar21 * 2;
        uVar28 = 1;
        do {
          uVar29 = uVar21 & 0xffffffff;
          if (this->m_has_subblocks != false) {
            uVar29 = (ulong)uVar11;
          }
          uVar5 = (this->m_params).m_alpha_component_indices[uVar28 - 1];
          uVar4 = (this->m_endpoint_indices).m_p[uVar29].field_0.component[uVar28];
          paVar6 = (this->m_alpha_clusters).m_p;
          pacVar7 = this->m_blocks;
          lVar23 = 0;
          piVar20 = local_a38;
          do {
            uVar24 = (uint)pacVar7[uVar21][lVar23].field_0.c[uVar5];
            lVar26 = 0;
            do {
              piVar1 = (int *)((long)paVar6->alpha_values + lVar26 * 4 + (ulong)((uint)uVar4 * 0x90)
                              );
              auVar33._0_4_ = uVar24 - *piVar1;
              auVar33._4_4_ = uVar24 - piVar1[1];
              auVar33._8_4_ = uVar24 - piVar1[2];
              auVar33._12_4_ = uVar24 - piVar1[3];
              auVar31._4_4_ = auVar33._4_4_;
              auVar31._0_4_ = auVar33._4_4_;
              auVar31._8_4_ = auVar33._12_4_;
              auVar31._12_4_ = auVar33._12_4_;
              piVar1 = piVar20 + lVar26;
              *(ulong *)piVar1 =
                   CONCAT44(auVar33._4_4_ * auVar33._4_4_,auVar33._0_4_ * auVar33._0_4_);
              piVar1[4] = (int)((auVar33._8_8_ & 0xffffffff) * (auVar33._8_8_ & 0xffffffff));
              piVar1[5] = (int)((auVar31._8_8_ & 0xffffffff) * (auVar31._8_8_ & 0xffffffff));
              lVar26 = lVar26 + 4;
            } while (lVar26 != 8);
            lVar23 = lVar23 + 1;
            piVar20 = piVar20 + 8;
          } while (lVar23 != 0x10);
          piVar20 = local_838;
          lVar23 = 0;
          do {
            uVar29 = 0;
            do {
              piVar20[uVar29] =
                   local_a38[(lVar23 * 2 + 1) * 8 + (uVar29 >> 3 & 0x1fffffff)] +
                   local_a38[lVar23 * 0x10 + (ulong)((uint)uVar29 & 7)];
              uVar29 = uVar29 + 1;
            } while (uVar29 != 0x40);
            lVar23 = lVar23 + 1;
            piVar20 = piVar20 + 0x40;
          } while (lVar23 != 8);
          uVar29 = (ulong)(this->m_alpha_selectors).m_size;
          if (uVar29 == 0) {
            uVar24 = 0;
          }
          else {
            uVar19 = 0;
            uVar25 = 0xffffffff;
            uVar24 = 0;
            do {
              uVar8 = (this->m_alpha_selectors).m_p[uVar19];
              uVar22 = (uint)(uVar8 >> 0x20);
              uVar22 = *(int *)((long)aiStack_738 + (ulong)((uint)(uVar8 >> 4) & 0xfc)) +
                       local_838[(uint)uVar8 & 0x3f] +
                       *(int *)((long)aiStack_638 + (ulong)((uint)(uVar8 >> 10) & 0xfc)) +
                       *(int *)((long)aiStack_538 + (ulong)((uint)(uVar8 >> 0x10) & 0xfc)) +
                       *(int *)((long)aiStack_438 + (ulong)((uint)(uVar8 >> 0x16) & 0xfc)) +
                       aiStack_338[(uint)(uVar8 >> 0x1e) & 0x3f] + aiStack_238[uVar22 >> 4 & 0x3f] +
                       aiStack_138[uVar22 >> 10 & 0x3f];
              if (uVar22 < uVar25) {
                uVar25 = uVar22;
                uVar24 = (uint)uVar19;
              }
              uVar19 = uVar19 + 1;
            } while (uVar29 != uVar19);
          }
          if (*(char *)((long)paVar6->refined_alpha_values + ((ulong)((uint)uVar4 * 0x90) - 4)) !=
              '\0') {
            lVar23 = 0;
            piVar20 = local_a38;
            do {
              uVar25 = (uint)pacVar7[uVar21][lVar23].field_0.c[uVar5];
              lVar26 = 0;
              do {
                piVar1 = (int *)((long)paVar6->refined_alpha_values +
                                lVar26 * 4 + (ulong)((uint)uVar4 * 0x90));
                auVar34._0_4_ = uVar25 - *piVar1;
                auVar34._4_4_ = uVar25 - piVar1[1];
                auVar34._8_4_ = uVar25 - piVar1[2];
                auVar34._12_4_ = uVar25 - piVar1[3];
                auVar32._4_4_ = auVar34._4_4_;
                auVar32._0_4_ = auVar34._4_4_;
                auVar32._8_4_ = auVar34._12_4_;
                auVar32._12_4_ = auVar34._12_4_;
                piVar1 = piVar20 + lVar26;
                *(ulong *)piVar1 =
                     CONCAT44(auVar34._4_4_ * auVar34._4_4_,auVar34._0_4_ * auVar34._0_4_);
                piVar1[4] = (int)((auVar34._8_8_ & 0xffffffff) * (auVar34._8_8_ & 0xffffffff));
                piVar1[5] = (int)((auVar32._8_8_ & 0xffffffff) * (auVar32._8_8_ & 0xffffffff));
                lVar26 = lVar26 + 4;
              } while (lVar26 != 8);
              lVar23 = lVar23 + 1;
              piVar20 = piVar20 + 8;
            } while (lVar23 != 0x10);
          }
          lVar23 = *pData_ptr + (ulong)uVar24 * 0x204;
          lVar26 = 0;
          piVar20 = local_a38;
          do {
            lVar30 = 0;
            do {
              piVar1 = (int *)(lVar23 + lVar30 * 4);
              iVar12 = piVar1[1];
              iVar13 = piVar1[2];
              iVar14 = piVar1[3];
              piVar2 = piVar20 + lVar30;
              iVar15 = piVar2[1];
              iVar16 = piVar2[2];
              iVar17 = piVar2[3];
              piVar3 = (int *)(lVar23 + lVar30 * 4);
              *piVar3 = *piVar1 + *piVar2;
              piVar3[1] = iVar12 + iVar15;
              piVar3[2] = iVar13 + iVar16;
              piVar3[3] = iVar14 + iVar17;
              lVar30 = lVar30 + 4;
            } while (lVar30 != 8);
            lVar26 = lVar26 + 1;
            piVar20 = piVar20 + 8;
            lVar23 = lVar23 + 0x20;
          } while (lVar26 != 0x10);
          *(undefined1 *)(*pData_ptr + 0x200 + (ulong)uVar24 * 0x204) = 1;
          uVar29 = uVar21 & 0xffffffff;
          if (this->m_has_subblocks != false) {
            uVar29 = (ulong)uVar11;
          }
          (this->m_selector_indices).m_p[uVar29].field_0.component[uVar28] = (uint16)uVar24;
          uVar28 = uVar28 + 1;
          uVar18 = this->m_num_alpha_blocks;
        } while (uVar28 < uVar18 + 1);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 < (uVar27 & 0xffffffff));
  }
  return;
}

Assistant:

void dxt_hc::create_alpha_selector_codebook_task(uint64 data, void* pData_ptr) {
  crnlib::vector<alpha_selector_details>& selector_details = *static_cast<crnlib::vector<alpha_selector_details>*>(pData_ptr);
  uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  uint E3[16][8];
  uint E6[8][64];
  for (uint n = m_has_subblocks ? m_num_blocks >> 1 : m_num_blocks, b = n * data / num_tasks, bEnd = n * (data + 1) / num_tasks; b < bEnd; b++) {
    for (uint c = cAlpha0; c < cAlpha0 + m_num_alpha_blocks; c++) {
      const uint alpha_pixel_comp = m_params.m_alpha_component_indices[c - cAlpha0];
      alpha_cluster& cluster = m_alpha_clusters[m_endpoint_indices[m_has_subblocks ? b << 1 : b].component[c]];
      uint* block_values = cluster.alpha_values;
      for (uint p = 0; p < 16; p++) {
        for (uint s = 0; s < 8; s++) {
          int delta = m_blocks[b][p][alpha_pixel_comp] - block_values[s];
          E3[p][s] = delta * delta;
        }
      }
      for (uint p = 0; p < 8; p++) {
        for (uint s = 0; s < 64; s++)
          E6[p][s] = E3[p << 1][s & 7] + E3[p << 1 | 1][s >> 3];
      }
      uint best_index = 0;
      for (uint best_error = cUINT32_MAX, s = 0; s < m_alpha_selectors.size(); s++) {
        uint64 selector = m_alpha_selectors[s];
        uint error = E6[0][selector & 63];
        error += E6[1][selector >> 6 & 63];
        error += E6[2][selector >> 12 & 63];
        error += E6[3][selector >> 18 & 63];
        error += E6[4][selector >> 24 & 63];
        error += E6[5][selector >> 30 & 63];
        error += E6[6][selector >> 36 & 63];
        error += E6[7][selector >> 42 & 63];
        if (error < best_error) {
          best_error = error;
          best_index = s;
        }
      }
      if (cluster.refined_alpha) {
        block_values = cluster.refined_alpha_values;
        for (uint p = 0; p < 16; p++) {
          for (uint s = 0; s < 8; s++) {
            int delta = m_blocks[b][p][alpha_pixel_comp] - block_values[s];
            E3[p][s] = delta * delta;
          }
        }
      }
      uint (&total_errors)[16][8] = selector_details[best_index].error;
      for (uint p = 0; p < 16; p++) {
        for (uint s = 0; s < 8; s++)
         total_errors[p][s] += E3[p][s];
      }
      selector_details[best_index].used = true;
      m_selector_indices[m_has_subblocks ? b << 1 : b].component[c] = best_index;
    }
  }
}